

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue_if_have_room
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *item)

{
  bool bVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->queue_mutex_);
  bVar1 = circular_q<spdlog::details::async_msg>::full(&this->q_);
  if (bVar1) {
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
    LOCK();
    (this->discard_counter_).super___atomic_base<unsigned_long>._M_i =
         (this->discard_counter_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else {
    circular_q<spdlog::details::async_msg>::push_back(&this->q_,item);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void enqueue_if_have_room(T &&item) {
        bool pushed = false;
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            if (!q_.full()) {
                q_.push_back(std::move(item));
                pushed = true;
            }
        }

        if (pushed) {
            push_cv_.notify_one();
        } else {
            ++discard_counter_;
        }
    }